

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_interface.cpp
# Opt level: O3

void UI::process_co_ords(vector<int,_std::allocator<int>_> *co_ords,int *points_gathered)

{
  int iVar1;
  iterator __position;
  char cVar2;
  bool bVar3;
  int *piVar4;
  long lVar5;
  undefined8 uVar6;
  _Alloc_hider _Var7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  string placeholder;
  int local_fc;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  pointer local_38;
  
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  local_f8._M_string_length = 0;
  local_f8.field_2._M_local_buf[0] = '\0';
  iVar1 = *points_gathered;
  if (iVar1 == 2) {
    paVar8 = &local_98.field_2;
    local_98._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"Please enter X2 co_ordinate:","");
    print_ln(&local_98);
    _Var7._M_p = local_98._M_dataplus._M_p;
  }
  else if (iVar1 == 1) {
    paVar8 = &local_78.field_2;
    local_78._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"Please enter Y1 co_ordinate:","");
    print_ln(&local_78);
    _Var7._M_p = local_78._M_dataplus._M_p;
  }
  else if (iVar1 == 0) {
    paVar8 = &local_58.field_2;
    local_58._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Please enter X1 co_ordinate:","");
    print_ln(&local_58);
    _Var7._M_p = local_58._M_dataplus._M_p;
  }
  else {
    paVar8 = &local_b8.field_2;
    local_b8._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"Please enter Y2 co_ordinate:","");
    print_ln(&local_b8);
    _Var7._M_p = local_b8._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var7._M_p != paVar8) {
    operator_delete(_Var7._M_p,paVar8->_M_allocated_capacity + 1);
  }
  cVar2 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x10);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&local_f8,cVar2);
  bVar3 = isinteger(&local_f8);
  _Var7._M_p = local_f8._M_dataplus._M_p;
  if (bVar3) {
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    *piVar4 = 0;
    lVar5 = strtol(_Var7._M_p,&local_38,10);
    if (local_38 == _Var7._M_p) {
      std::__throw_invalid_argument("stoi");
LAB_00114d14:
      uVar6 = std::__throw_out_of_range("stoi");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,
                        CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                 local_f8.field_2._M_local_buf[0]) + 1);
      }
      _Unwind_Resume(uVar6);
    }
    local_fc = (int)lVar5;
    if ((local_fc != lVar5) || (*piVar4 == 0x22)) goto LAB_00114d14;
    if (*piVar4 == 0) {
      *piVar4 = iVar1;
    }
    __position._M_current =
         (co_ords->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (__position._M_current ==
        (co_ords->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(co_ords,__position,&local_fc);
    }
    else {
      *__position._M_current = local_fc;
      (co_ords->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = __position._M_current + 1;
    }
    if (2 < *points_gathered) goto LAB_00114cdf;
    *points_gathered = *points_gathered + 1;
  }
  else {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"The last value entered is not an integer.","");
    print_ln(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  process_co_ords(co_ords,points_gathered);
LAB_00114cdf:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,
                    CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                             local_f8.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void UI::process_co_ords(std::vector<int> &co_ords, int &points_gathered)
{
    std::string placeholder;
    switch (points_gathered)
    {
    case 0:
        print_ln("Please enter X1 co_ordinate:");
        break;
    case 1:
        print_ln("Please enter Y1 co_ordinate:");
        break;
    case 2:
        print_ln("Please enter X2 co_ordinate:");
        break;
    default:
        print_ln("Please enter Y2 co_ordinate:");
        break;
    }
    getline(std::cin, placeholder);
    if (isinteger(placeholder))
    {
        co_ords.push_back(std::stoi(placeholder));
        if (points_gathered < 3)
        {
            points_gathered++;
            process_co_ords(co_ords, points_gathered);
        }
    }
    else
    {
        print_ln("The last value entered is not an integer.");
        process_co_ords(co_ords, points_gathered);
    }
}